

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

void __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
::body(work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
       *this)

{
  type demand;
  shutdown_ex_t *anon_var_0;
  undefined1 local_20 [8];
  demand_unique_ptr_t d;
  work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
  *this_local;
  
  d._M_t.
  super___uniq_ptr_impl<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  .super__Head_base<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_false>.
  _M_head_impl = (__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>,_true,_true>
                  )query_current_thread_id();
  (this->
  super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  ).super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
  m_thread_id._M_thread =
       (native_handle_type)
       d._M_t.
       super___uniq_ptr_impl<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
       .
       super__Head_base<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_false>
       ._M_head_impl;
  do {
    pop_demand((work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
                *)local_20);
    demand = std::
             unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
             ::operator*((unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
                          *)local_20);
    call_handler(this,&demand->super_execution_demand_t);
    std::
    unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
    ::~unique_ptr((unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
                   *)local_20);
  } while( true );
}

Assistant:

void
		body()
			{
				this->m_thread_id = so_5::query_current_thread_id();

				try
					{
						for(;;)
							{
								auto d = this->pop_demand();
								this->call_handler( *d );
							}
					}
				catch( const typename DEMAND_QUEUE::shutdown_ex_t & )
					{}
			}